

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GeneratePrivateMembers
          (SingularStringView *this,Printer *p)

{
  allocator<char> local_f1;
  char *local_f0;
  string local_e8;
  Sub local_c8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Str",&local_f1);
  if ((this->super_FieldGeneratorBase).is_inlined_ == false) {
    local_f0 = "ArenaStringPtr";
    if (this->opts_->experimental_use_micro_string != false) {
      local_f0 = "MicroString";
    }
  }
  else {
    local_f0 = "InlinedStringField";
  }
  io::Printer::Sub::Sub<char_const*>(&local_c8,&local_e8,&local_f0);
  io::Printer::Emit(p,&local_c8,1,0x31,"\n              $pbi$::$Str$ $name$_;\n            ");
  io::Printer::Sub::~Sub(&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void GeneratePrivateMembers(io::Printer* p) const override {
    // Skips the automatic destruction if inlined; rather calls it explicitly if
    // allocating arena is null.
    p->Emit({{"Str", is_inlined()         ? "InlinedStringField"
                     : use_micro_string() ? "MicroString"
                                          : "ArenaStringPtr"}},
            R"cc(
              $pbi$::$Str$ $name$_;
            )cc");
  }